

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O2

size_t __thiscall Imf_3_4::IDManifest::find(IDManifest *this,string *channel)

{
  ulong uVar1;
  const_iterator cVar2;
  pointer pCVar3;
  ulong uVar4;
  long lVar5;
  
  pCVar3 = (this->_manifest).
           super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = 8;
  uVar4 = 0;
  while( true ) {
    uVar1 = ((long)(this->_manifest).
                   super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3) / 0xd0;
    if (uVar1 <= uVar4) {
      return uVar1;
    }
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)pCVar3 + lVar5 + -8),channel);
    pCVar3 = (this->_manifest).
             super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((_Base_ptr)((long)&(pCVar3->_channels)._M_t + lVar5) != cVar2._M_node) break;
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 0xd0;
  }
  return uVar4;
}

Assistant:

size_t
IDManifest::find (const string& channel) const
{
    // search the set of channels for each ChannelGroupManifest searching for
    // one that contains 'channel'
    for (size_t i = 0; i < _manifest.size (); ++i)
    {

        if (_manifest[i].getChannels ().find (channel) !=
            _manifest[i].getChannels ().end ())
        {
            return i;
        }
    }
    //  not find, return size()
    return _manifest.size ();
}